

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O1

void av1_idct16(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int32_t *input_00;
  int iVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  undefined7 in_register_00000011;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int32_t iVar16;
  long lVar17;
  ulong uVar18;
  int32_t step [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  int local_70;
  undefined8 local_6c;
  int local_64;
  undefined8 local_60;
  int32_t *local_58;
  int local_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  long local_40;
  ulong local_38;
  
  uVar18 = CONCAT71(in_register_00000011,cos_bit) & 0xffffffff;
  lVar11 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  *output = *input;
  output[1] = input[8];
  output[2] = input[4];
  output[3] = input[0xc];
  output[4] = input[2];
  output[5] = input[10];
  output[6] = input[6];
  output[7] = input[0xe];
  output[8] = input[1];
  output[9] = input[9];
  output[10] = input[5];
  output[0xb] = input[0xd];
  output[0xc] = input[3];
  output[0xd] = input[0xb];
  output[0xe] = input[7];
  output[0xf] = input[0xf];
  av1_range_check_buf(1,input,output,0x10,stage_range[1]);
  local_98 = *(undefined8 *)output;
  uStack_90 = *(undefined8 *)(output + 2);
  local_88 = *(undefined8 *)(output + 4);
  uStack_80 = *(undefined8 *)(output + 6);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x250);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x170);
  _local_48 = CONCAT44(uStack_44,iVar13);
  lVar17 = 1L << (cos_bit - 1U & 0x3f);
  bVar9 = (byte)uVar18;
  local_78._0_4_ =
       (int32_t)(output[8] * iVar7 + lVar17 + (long)-(iVar13 * output[0xf]) >> (bVar9 & 0x3f));
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1d0);
  _local_50 = CONCAT44(uStack_4c,iVar2);
  iVar10 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1f0);
  local_78._4_4_ =
       (int)(output[9] * iVar2 + lVar17 + (long)-(iVar10 * output[0xe]) >> (bVar9 & 0x3f));
  iVar12 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x210);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1b0);
  local_70 = (int)(output[10] * iVar12 + lVar17 + (long)-(iVar3 * output[0xd]) >> (cos_bit & 0x3fU))
  ;
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x230);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar11 + 400);
  local_6c._0_4_ =
       (int)(output[0xb] * iVar5 + lVar17 + (long)-(iVar4 * output[0xc]) >> (bVar9 & 0x3f));
  local_6c._4_4_ =
       (int)(iVar4 * output[0xb] + lVar17 + (long)(output[0xc] * iVar5) >> (bVar9 & 0x3f));
  local_64 = (int)(iVar3 * output[10] + lVar17 + (long)(output[0xd] * iVar12) >> (cos_bit & 0x3fU));
  iVar12 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x180);
  local_60._0_4_ =
       (int)(iVar10 * output[9] + lVar17 + (long)(output[0xe] * iVar2) >> (cos_bit & 0x3fU));
  local_60._4_4_ =
       (int32_t)(iVar13 * output[8] + lVar17 + (long)(output[0xf] * iVar7) >> (cos_bit & 0x3fU));
  local_58 = input;
  local_40 = lVar11;
  local_38 = uVar18;
  av1_range_check_buf(2,input,(int32_t *)&local_98,0x10,stage_range[2]);
  *(undefined8 *)output = local_98;
  *(undefined8 *)(output + 2) = uStack_90;
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x240);
  bVar9 = (byte)local_38;
  output[4] = (int32_t)((int)local_88 * iVar7 + lVar17 + (long)-(iVar12 * uStack_80._4_4_) >>
                       (bVar9 & 0x3f));
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1c0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x200);
  output[5] = (int32_t)(local_88._4_4_ * iVar13 + lVar17 + (long)-(iVar2 * (int)uStack_80) >>
                       (bVar9 & 0x3f));
  output[6] = (int32_t)(iVar2 * local_88._4_4_ + lVar17 + (long)((int)uStack_80 * iVar13) >>
                       (bVar9 & 0x3f));
  output[7] = (int32_t)(iVar12 * (int)local_88 + lVar17 + (long)(uStack_80._4_4_ * iVar7) >>
                       (bVar9 & 0x3f));
  iVar7 = local_78._4_4_ + (int32_t)local_78;
  if ('\0' < stage_range[3]) {
    lVar15 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar14 = (long)iVar7;
    lVar8 = lVar15 + -1;
    if (lVar14 < lVar15 + -1) {
      lVar8 = lVar14;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar14,-lVar15) == lVar14 + lVar15 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[8] = iVar7;
  iVar7 = (int32_t)local_78 - local_78._4_4_;
  if ('\0' < stage_range[3]) {
    lVar14 = (long)iVar7;
    lVar15 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar8 = lVar15 + -1;
    if (lVar14 < lVar15 + -1) {
      lVar8 = lVar14;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar14,-lVar15) == lVar14 + lVar15 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[9] = iVar7;
  iVar7 = (int)local_6c - local_70;
  if ('\0' < stage_range[3]) {
    lVar14 = (long)iVar7;
    lVar15 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar8 = lVar15 + -1;
    if (lVar14 < lVar15 + -1) {
      lVar8 = lVar14;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar14,-lVar15) == lVar14 + lVar15 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[10] = iVar7;
  iVar7 = (int)local_6c + local_70;
  if ('\0' < stage_range[3]) {
    lVar14 = (long)iVar7;
    lVar15 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar8 = lVar15 + -1;
    if (lVar14 < lVar15 + -1) {
      lVar8 = lVar14;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar14,-lVar15) == lVar14 + lVar15 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[0xb] = iVar7;
  iVar7 = local_64 + local_6c._4_4_;
  if ('\0' < stage_range[3]) {
    lVar14 = (long)iVar7;
    lVar15 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar8 = lVar15 + -1;
    if (lVar14 < lVar15 + -1) {
      lVar8 = lVar14;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar14,-lVar15) == lVar14 + lVar15 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[0xc] = iVar7;
  iVar7 = local_6c._4_4_ - local_64;
  if ('\0' < stage_range[3]) {
    lVar14 = (long)iVar7;
    lVar15 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar8 = lVar15 + -1;
    if (lVar14 < lVar15 + -1) {
      lVar8 = lVar14;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar14,-lVar15) == lVar14 + lVar15 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[0xd] = iVar7;
  iVar7 = local_60._4_4_ - (int)local_60;
  if ('\0' < stage_range[3]) {
    lVar14 = (long)iVar7;
    lVar15 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar8 = lVar15 + -1;
    if (lVar14 < lVar15 + -1) {
      lVar8 = lVar14;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar14,-lVar15) == lVar14 + lVar15 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[0xe] = iVar7;
  iVar7 = local_60._4_4_ + (int)local_60;
  if ('\0' < stage_range[3]) {
    lVar14 = (long)iVar7;
    lVar15 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar8 = lVar15 + -1;
    if (lVar14 < lVar15 + -1) {
      lVar8 = lVar14;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar14,-lVar15) == lVar14 + lVar15 < 0) {
      lVar6 = lVar8;
    }
    iVar7 = (int)lVar6;
  }
  output[0xf] = iVar7;
  av1_range_check_buf(3,local_58,output,0x10,stage_range[3]);
  input_00 = local_58;
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1e0);
  lVar14 = (long)iVar7;
  lVar8 = *output * lVar14 + lVar17;
  local_98._0_4_ = (int)(output[1] * iVar7 + lVar8 >> (bVar9 & 0x3f));
  iVar10 = -iVar7;
  local_98._4_4_ = (int)(output[1] * iVar10 + lVar8 >> (bVar9 & 0x3f));
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1a0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x220);
  iVar12 = -iVar13;
  uStack_90._0_4_ = (int)(output[2] * iVar2 + lVar17 + (long)(output[3] * iVar12) >> (bVar9 & 0x3f))
  ;
  uStack_90._4_4_ = (int)(iVar13 * output[2] + lVar17 + (long)(output[3] * iVar2) >> (bVar9 & 0x3f))
  ;
  local_88._0_4_ = output[5] + output[4];
  cVar1 = stage_range[4];
  if ('\0' < cVar1) {
    lVar8 = (long)(int)local_88;
    lVar15 = 1L << (cVar1 - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    local_88._0_4_ = (int)lVar6;
  }
  local_88._4_4_ = output[4] - output[5];
  if ('\0' < cVar1) {
    lVar8 = (long)local_88._4_4_;
    lVar15 = 1L << (cVar1 - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    local_88._4_4_ = (int)lVar6;
  }
  uStack_80._0_4_ = output[7] - output[6];
  if ('\0' < cVar1) {
    lVar8 = (long)(int)uStack_80;
    lVar15 = 1L << (cVar1 - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    uStack_80._0_4_ = (int)lVar6;
  }
  uStack_80._4_4_ = output[7] + output[6];
  if ('\0' < cVar1) {
    lVar8 = (long)uStack_80._4_4_;
    lVar15 = 1L << (cVar1 - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    uStack_80._4_4_ = (int32_t)lVar6;
  }
  local_78._0_4_ = output[8];
  local_78._4_4_ =
       (int)(output[0xe] * iVar2 + lVar17 + (long)(output[9] * iVar12) >> (bVar9 & 0x3f));
  local_70 = (int)(-(iVar2 * output[10]) + lVar17 + (long)(output[0xd] * iVar12) >> (bVar9 & 0x3f));
  local_6c = *(undefined8 *)(output + 0xb);
  local_64 = (int)(output[0xd] * iVar2 + lVar17 + (long)(output[10] * iVar12) >> (bVar9 & 0x3f));
  local_60._0_4_ =
       (int)(output[9] * iVar2 + lVar17 + (long)(iVar13 * output[0xe]) >> (bVar9 & 0x3f));
  local_60._4_4_ = output[0xf];
  av1_range_check_buf(4,local_58,(int32_t *)&local_98,0x10,cVar1);
  iVar13 = uStack_90._4_4_ + (int)local_98;
  if ('\0' < stage_range[5]) {
    lVar8 = (long)iVar13;
    lVar15 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    iVar13 = (int)lVar6;
  }
  *output = iVar13;
  iVar13 = (int)uStack_90 + local_98._4_4_;
  if ('\0' < stage_range[5]) {
    lVar8 = (long)iVar13;
    lVar15 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    iVar13 = (int)lVar6;
  }
  output[1] = iVar13;
  iVar13 = local_98._4_4_ - (int)uStack_90;
  if ('\0' < stage_range[5]) {
    lVar8 = (long)iVar13;
    lVar15 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    iVar13 = (int)lVar6;
  }
  output[2] = iVar13;
  iVar13 = (int)local_98 - uStack_90._4_4_;
  if ('\0' < stage_range[5]) {
    lVar8 = (long)iVar13;
    lVar15 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    iVar13 = (int)lVar6;
  }
  output[3] = iVar13;
  output[4] = (int)local_88;
  lVar11 = (int)uStack_80 * lVar14 + lVar17;
  output[5] = (int32_t)(local_88._4_4_ * iVar10 + lVar11 >> (bVar9 & 0x3f));
  output[6] = (int32_t)(iVar7 * local_88._4_4_ + lVar11 >> (bVar9 & 0x3f));
  output[7] = uStack_80._4_4_;
  iVar13 = (int)local_6c + (int32_t)local_78;
  if ('\0' < stage_range[5]) {
    lVar8 = (long)iVar13;
    lVar15 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    iVar13 = (int)lVar6;
  }
  output[8] = iVar13;
  iVar13 = local_70 + local_78._4_4_;
  if ('\0' < stage_range[5]) {
    lVar8 = (long)iVar13;
    lVar15 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    iVar13 = (int)lVar6;
  }
  output[9] = iVar13;
  iVar13 = local_78._4_4_ - local_70;
  if ('\0' < stage_range[5]) {
    lVar8 = (long)iVar13;
    lVar15 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    iVar13 = (int)lVar6;
  }
  output[10] = iVar13;
  iVar13 = (int32_t)local_78 - (int)local_6c;
  if ('\0' < stage_range[5]) {
    lVar8 = (long)iVar13;
    lVar15 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    iVar13 = (int)lVar6;
  }
  output[0xb] = iVar13;
  iVar13 = local_60._4_4_ - local_6c._4_4_;
  if ('\0' < stage_range[5]) {
    lVar8 = (long)iVar13;
    lVar15 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    iVar13 = (int)lVar6;
  }
  output[0xc] = iVar13;
  iVar16 = (int)local_60 - local_64;
  if ('\0' < stage_range[5]) {
    lVar8 = (long)iVar16;
    lVar15 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    iVar16 = (int32_t)lVar6;
  }
  output[0xd] = iVar16;
  iVar13 = (int)local_60 + local_64;
  if ('\0' < stage_range[5]) {
    lVar8 = (long)iVar13;
    lVar15 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    iVar13 = (int)lVar6;
  }
  output[0xe] = iVar13;
  iVar13 = local_60._4_4_ + local_6c._4_4_;
  if ('\0' < stage_range[5]) {
    lVar8 = (long)iVar13;
    lVar15 = 1L << (stage_range[5] - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    iVar13 = (int)lVar6;
  }
  output[0xf] = iVar13;
  av1_range_check_buf(5,input_00,output,0x10,stage_range[5]);
  local_98._0_4_ = output[7] + *output;
  cVar1 = stage_range[6];
  if ('\0' < cVar1) {
    lVar8 = (long)(int)local_98;
    lVar15 = 1L << (cVar1 - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    local_98._0_4_ = (int)lVar6;
  }
  local_98._4_4_ = output[6] + output[1];
  if ('\0' < cVar1) {
    lVar8 = (long)local_98._4_4_;
    lVar15 = 1L << (cVar1 - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    local_98._4_4_ = (int)lVar6;
  }
  uStack_90._0_4_ = output[5] + output[2];
  if ('\0' < cVar1) {
    lVar8 = (long)(int)uStack_90;
    lVar15 = 1L << (cVar1 - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    uStack_90._0_4_ = (int)lVar6;
  }
  uStack_90._4_4_ = output[4] + output[3];
  if ('\0' < cVar1) {
    lVar15 = (long)uStack_90._4_4_;
    lVar8 = 1L << (cVar1 - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar15 < lVar8 + -1) {
      lVar11 = lVar15;
    }
    lVar6 = -lVar8;
    if (SBORROW8(lVar15,-lVar8) == lVar15 + lVar8 < 0) {
      lVar6 = lVar11;
    }
    uStack_90._4_4_ = (int)lVar6;
  }
  local_88._0_4_ = output[3] - output[4];
  if ('\0' < cVar1) {
    lVar8 = (long)(int)local_88;
    lVar15 = 1L << (cVar1 - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    local_88._0_4_ = (int)lVar6;
  }
  local_88._4_4_ = output[2] - output[5];
  if ('\0' < cVar1) {
    lVar8 = (long)local_88._4_4_;
    lVar15 = 1L << (cVar1 - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    local_88._4_4_ = (int)lVar6;
  }
  uStack_80._0_4_ = output[1] - output[6];
  if ('\0' < cVar1) {
    lVar8 = (long)(int)uStack_80;
    lVar15 = 1L << (cVar1 - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    uStack_80._0_4_ = (int)lVar6;
  }
  uStack_80._4_4_ = *output - output[7];
  if ('\0' < cVar1) {
    lVar8 = (long)uStack_80._4_4_;
    lVar15 = 1L << (cVar1 - 1U & 0x3f);
    lVar11 = lVar15 + -1;
    if (lVar8 < lVar15 + -1) {
      lVar11 = lVar8;
    }
    lVar6 = -lVar15;
    if (SBORROW8(lVar8,-lVar15) == lVar8 + lVar15 < 0) {
      lVar6 = lVar11;
    }
    uStack_80._4_4_ = (int32_t)lVar6;
  }
  local_78 = *(undefined8 *)(output + 8);
  lVar11 = output[0xd] * lVar14 + lVar17;
  local_70 = (int)(output[10] * iVar10 + lVar11 >> (bVar9 & 0x3f));
  lVar17 = output[0xc] * lVar14 + lVar17;
  local_6c._0_4_ = (int)(iVar10 * output[0xb] + lVar17 >> (bVar9 & 0x3f));
  local_6c._4_4_ = (int)(iVar7 * output[0xb] + lVar17 >> (bVar9 & 0x3f));
  local_64 = (int)(iVar7 * output[10] + lVar11 >> (bVar9 & 0x3f));
  local_60 = *(undefined8 *)(output + 0xe);
  av1_range_check_buf(6,local_58,(int32_t *)&local_98,0x10,cVar1);
  iVar7 = local_60._4_4_ + (int)local_98;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)iVar7;
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    lVar14 = -lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      lVar14 = lVar11;
    }
    iVar7 = (int)lVar14;
  }
  *output = iVar7;
  iVar7 = (int)local_60 + local_98._4_4_;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)iVar7;
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    lVar14 = -lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      lVar14 = lVar11;
    }
    iVar7 = (int)lVar14;
  }
  output[1] = iVar7;
  iVar7 = local_64 + (int)uStack_90;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)iVar7;
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    lVar14 = -lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      lVar14 = lVar11;
    }
    iVar7 = (int)lVar14;
  }
  output[2] = iVar7;
  iVar7 = local_6c._4_4_ + uStack_90._4_4_;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)iVar7;
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    lVar14 = -lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      lVar14 = lVar11;
    }
    iVar7 = (int)lVar14;
  }
  output[3] = iVar7;
  iVar7 = (int)local_6c + (int)local_88;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)iVar7;
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    lVar14 = -lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      lVar14 = lVar11;
    }
    iVar7 = (int)lVar14;
  }
  output[4] = iVar7;
  iVar7 = local_70 + local_88._4_4_;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)iVar7;
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    lVar14 = -lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      lVar14 = lVar11;
    }
    iVar7 = (int)lVar14;
  }
  output[5] = iVar7;
  iVar7 = local_78._4_4_ + (int)uStack_80;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)iVar7;
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    lVar14 = -lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      lVar14 = lVar11;
    }
    iVar7 = (int)lVar14;
  }
  output[6] = iVar7;
  iVar7 = (int32_t)local_78 + uStack_80._4_4_;
  if ('\0' < stage_range[7]) {
    lVar8 = (long)iVar7;
    lVar17 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar17 + -1;
    if (lVar8 < lVar17 + -1) {
      lVar11 = lVar8;
    }
    iVar7 = (int)-lVar17;
    if (SBORROW8(lVar8,-lVar17) == lVar8 + lVar17 < 0) {
      iVar7 = (int)lVar11;
    }
  }
  output[7] = iVar7;
  iVar7 = uStack_80._4_4_ - (int32_t)local_78;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)(uStack_80._4_4_ - (int32_t)local_78);
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    iVar7 = (int32_t)-lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      iVar7 = (int32_t)lVar11;
    }
  }
  output[8] = iVar7;
  iVar7 = (int)uStack_80 - local_78._4_4_;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)((int)uStack_80 - local_78._4_4_);
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    iVar7 = (int)-lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      iVar7 = (int)lVar11;
    }
  }
  output[9] = iVar7;
  iVar7 = local_88._4_4_ - local_70;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)(local_88._4_4_ - local_70);
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    iVar7 = (int32_t)-lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      iVar7 = (int32_t)lVar11;
    }
  }
  output[10] = iVar7;
  iVar7 = (int)local_88 - (int)local_6c;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)((int)local_88 - (int)local_6c);
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    iVar7 = (int32_t)-lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      iVar7 = (int32_t)lVar11;
    }
  }
  output[0xb] = iVar7;
  iVar7 = uStack_90._4_4_ - local_6c._4_4_;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)(uStack_90._4_4_ - local_6c._4_4_);
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    iVar7 = (int32_t)-lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      iVar7 = (int32_t)lVar11;
    }
  }
  output[0xc] = iVar7;
  iVar7 = (int)uStack_90 - local_64;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)((int)uStack_90 - local_64);
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    iVar7 = (int32_t)-lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      iVar7 = (int32_t)lVar11;
    }
  }
  output[0xd] = iVar7;
  iVar7 = local_98._4_4_ - (int)local_60;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)(local_98._4_4_ - (int)local_60);
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    iVar7 = (int)-lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      iVar7 = (int)lVar11;
    }
  }
  output[0xe] = iVar7;
  local_98._0_4_ = (int)local_98 - local_60._4_4_;
  if ('\0' < stage_range[7]) {
    lVar17 = (long)(int)local_98;
    lVar8 = 1L << (stage_range[7] - 1U & 0x3f);
    lVar11 = lVar8 + -1;
    if (lVar17 < lVar8 + -1) {
      lVar11 = lVar17;
    }
    lVar14 = -lVar8;
    if (SBORROW8(lVar17,-lVar8) == lVar17 + lVar8 < 0) {
      lVar14 = lVar11;
    }
    local_98._0_4_ = (int)lVar14;
  }
  output[0xf] = (int)local_98;
  return;
}

Assistant:

void av1_idct16(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 16;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[16];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = input[8];
  bf1[2] = input[4];
  bf1[3] = input[12];
  bf1[4] = input[2];
  bf1[5] = input[10];
  bf1[6] = input[6];
  bf1[7] = input[14];
  bf1[8] = input[1];
  bf1[9] = input[9];
  bf1[10] = input[5];
  bf1[11] = input[13];
  bf1[12] = input[3];
  bf1[13] = input[11];
  bf1[14] = input[7];
  bf1[15] = input[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = bf0[6];
  bf1[7] = bf0[7];
  bf1[8] = half_btf(cospi[60], bf0[8], -cospi[4], bf0[15], cos_bit);
  bf1[9] = half_btf(cospi[28], bf0[9], -cospi[36], bf0[14], cos_bit);
  bf1[10] = half_btf(cospi[44], bf0[10], -cospi[20], bf0[13], cos_bit);
  bf1[11] = half_btf(cospi[12], bf0[11], -cospi[52], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[52], bf0[11], cospi[12], bf0[12], cos_bit);
  bf1[13] = half_btf(cospi[20], bf0[10], cospi[44], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[36], bf0[9], cospi[28], bf0[14], cos_bit);
  bf1[15] = half_btf(cospi[4], bf0[8], cospi[60], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[56], bf0[4], -cospi[8], bf0[7], cos_bit);
  bf1[5] = half_btf(cospi[24], bf0[5], -cospi[40], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[40], bf0[5], cospi[24], bf0[6], cos_bit);
  bf1[7] = half_btf(cospi[8], bf0[4], cospi[56], bf0[7], cos_bit);
  bf1[8] = clamp_value(bf0[8] + bf0[9], stage_range[stage]);
  bf1[9] = clamp_value(bf0[8] - bf0[9], stage_range[stage]);
  bf1[10] = clamp_value(-bf0[10] + bf0[11], stage_range[stage]);
  bf1[11] = clamp_value(bf0[10] + bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[12] + bf0[13], stage_range[stage]);
  bf1[13] = clamp_value(bf0[12] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(-bf0[14] + bf0[15], stage_range[stage]);
  bf1[15] = clamp_value(bf0[14] + bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[32], bf0[0], -cospi[32], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], -cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[16], bf0[2], cospi[48], bf0[3], cos_bit);
  bf1[4] = clamp_value(bf0[4] + bf0[5], stage_range[stage]);
  bf1[5] = clamp_value(bf0[4] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(-bf0[6] + bf0[7], stage_range[stage]);
  bf1[7] = clamp_value(bf0[6] + bf0[7], stage_range[stage]);
  bf1[8] = bf0[8];
  bf1[9] = half_btf(-cospi[16], bf0[9], cospi[48], bf0[14], cos_bit);
  bf1[10] = half_btf(-cospi[48], bf0[10], -cospi[16], bf0[13], cos_bit);
  bf1[11] = bf0[11];
  bf1[12] = bf0[12];
  bf1[13] = half_btf(-cospi[16], bf0[10], cospi[48], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[48], bf0[9], cospi[16], bf0[14], cos_bit);
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[3], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[2], stage_range[stage]);
  bf1[2] = clamp_value(bf0[1] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[0] - bf0[3], stage_range[stage]);
  bf1[4] = bf0[4];
  bf1[5] = half_btf(-cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[7] = bf0[7];
  bf1[8] = clamp_value(bf0[8] + bf0[11], stage_range[stage]);
  bf1[9] = clamp_value(bf0[9] + bf0[10], stage_range[stage]);
  bf1[10] = clamp_value(bf0[9] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[8] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(-bf0[12] + bf0[15], stage_range[stage]);
  bf1[13] = clamp_value(-bf0[13] + bf0[14], stage_range[stage]);
  bf1[14] = clamp_value(bf0[13] + bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[12] + bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = clamp_value(bf0[0] + bf0[7], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[6], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[5], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[4], stage_range[stage]);
  bf1[4] = clamp_value(bf0[3] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[2] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[1] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[0] - bf0[7], stage_range[stage]);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = half_btf(-cospi[32], bf0[10], cospi[32], bf0[13], cos_bit);
  bf1[11] = half_btf(-cospi[32], bf0[11], cospi[32], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[32], bf0[11], cospi[32], bf0[12], cos_bit);
  bf1[13] = half_btf(cospi[32], bf0[10], cospi[32], bf0[13], cos_bit);
  bf1[14] = bf0[14];
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[15], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[14], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[13], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[12], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[11], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[10], stage_range[stage]);
  bf1[6] = clamp_value(bf0[6] + bf0[9], stage_range[stage]);
  bf1[7] = clamp_value(bf0[7] + bf0[8], stage_range[stage]);
  bf1[8] = clamp_value(bf0[7] - bf0[8], stage_range[stage]);
  bf1[9] = clamp_value(bf0[6] - bf0[9], stage_range[stage]);
  bf1[10] = clamp_value(bf0[5] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[4] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[3] - bf0[12], stage_range[stage]);
  bf1[13] = clamp_value(bf0[2] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(bf0[1] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[0] - bf0[15], stage_range[stage]);
}